

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containersNative.cpp
# Opt level: O0

INativePtr * __thiscall
chatra::emb::containers::ContainersPackageInterface::restoreNativePtr
          (ContainersPackageInterface *this,PackageContext *pct,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream)

{
  ByteArray *pBVar1;
  ByteArrayData *this_00;
  NativeException *this_01;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  uchar *local_70;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  const_iterator local_58;
  unsigned_long local_50;
  unsigned_long size;
  ByteArrayData *local_38;
  ByteArrayData *self;
  size_t sStack_28;
  Type type;
  size_t offset;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *stream_local;
  PackageContext *pct_local;
  ContainersPackageInterface *this_local;
  
  sStack_28 = 0;
  offset = (size_t)stream;
  stream_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)pct;
  pct_local = (PackageContext *)this;
  self._4_4_ = readInt<chatra::emb::containers::Type>(stream,&stack0xffffffffffffffd8);
  if (self._4_4_ == ByteArray) {
    this_00 = (ByteArrayData *)operator_new(0x30);
    ByteArrayData::ByteArrayData(this_00);
    local_38 = this_00;
    local_50 = readInt<unsigned_long>
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)offset,
                          &stack0xffffffffffffffd8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&(local_38->super_ByteArray).data,local_50);
    pBVar1 = &local_38->super_ByteArray;
    local_58 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                         (&(local_38->super_ByteArray).data);
    local_68._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)offset);
    local_60 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_68,sStack_28);
    local_80._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)offset);
    local_78 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_80,sStack_28);
    local_70 = (uchar *)__gnu_cxx::
                        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+(&local_78,local_50);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&pBVar1->data,local_58,
               local_60,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         )local_70);
    return (INativePtr *)local_38;
  }
  this_01 = (NativeException *)__cxa_allocate_exception(0x28);
  memset(this_01,0,0x28);
  NativeException::NativeException(this_01);
  __cxa_throw(this_01,&NativeException::typeinfo,NativeException::~NativeException);
}

Assistant:

INativePtr* restoreNativePtr(PackageContext& pct, const std::vector<uint8_t>& stream) override {
		(void)pct;
		size_t offset = 0;

		auto type = readInt<Type>(stream, offset);
		switch (type) {
		case Type::ByteArray: {
			auto* self = new ByteArrayData();
			auto size = readInt<size_t>(stream, offset);
			self->data.reserve(size);
			self->data.insert(self->data.cend(), stream.cbegin() + offset, stream.cbegin() + offset + size);
			return self;
		}

		default:
			throw NativeException();
		}
	}